

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O0

void __thiscall
vkt::Draw::PipelineCreateInfo::ViewportState::ViewportState
          (ViewportState *this,deUint32 _viewportCount,
          vector<vk::VkViewport,_std::allocator<vk::VkViewport>_> *_viewports,
          vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_> *_scissors)

{
  size_type sVar1;
  reference pvVar2;
  reference pvVar3;
  vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_> *_scissors_local;
  vector<vk::VkViewport,_std::allocator<vk::VkViewport>_> *_viewports_local;
  deUint32 _viewportCount_local;
  ViewportState *this_local;
  
  std::vector<vk::VkViewport,_std::allocator<vk::VkViewport>_>::vector(&this->m_viewports);
  std::vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::vector(&this->m_scissors);
  (this->super_VkPipelineViewportStateCreateInfo).sType =
       VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  (this->super_VkPipelineViewportStateCreateInfo).pNext = (void *)0x0;
  (this->super_VkPipelineViewportStateCreateInfo).flags = 0;
  (this->super_VkPipelineViewportStateCreateInfo).viewportCount = _viewportCount;
  (this->super_VkPipelineViewportStateCreateInfo).scissorCount = _viewportCount;
  sVar1 = std::vector<vk::VkViewport,_std::allocator<vk::VkViewport>_>::size(_viewports);
  if (sVar1 == 0) {
    std::vector<vk::VkViewport,_std::allocator<vk::VkViewport>_>::resize
              (&this->m_viewports,
               (ulong)(this->super_VkPipelineViewportStateCreateInfo).viewportCount);
    pvVar2 = std::vector<vk::VkViewport,_std::allocator<vk::VkViewport>_>::operator[]
                       (&this->m_viewports,0);
    sVar1 = std::vector<vk::VkViewport,_std::allocator<vk::VkViewport>_>::size(&this->m_viewports);
    ::deMemset(pvVar2,0,sVar1 * 0x18);
  }
  else {
    std::vector<vk::VkViewport,_std::allocator<vk::VkViewport>_>::operator=
              (&this->m_viewports,_viewports);
  }
  sVar1 = std::vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::size(_scissors);
  if (sVar1 == 0) {
    std::vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::resize
              (&this->m_scissors,(ulong)(this->super_VkPipelineViewportStateCreateInfo).scissorCount
              );
    pvVar3 = std::vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::operator[]
                       (&this->m_scissors,0);
    sVar1 = std::vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::size(&this->m_scissors);
    ::deMemset(pvVar3,0,sVar1 << 4);
  }
  else {
    std::vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::operator=(&this->m_scissors,_scissors)
    ;
  }
  pvVar2 = std::vector<vk::VkViewport,_std::allocator<vk::VkViewport>_>::operator[]
                     (&this->m_viewports,0);
  (this->super_VkPipelineViewportStateCreateInfo).pViewports = pvVar2;
  pvVar3 = std::vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::operator[](&this->m_scissors,0)
  ;
  (this->super_VkPipelineViewportStateCreateInfo).pScissors = pvVar3;
  return;
}

Assistant:

PipelineCreateInfo::ViewportState::ViewportState (deUint32						_viewportCount,
												  std::vector<vk::VkViewport>	_viewports,
												  std::vector<vk::VkRect2D>		_scissors)
{
	sType = vk::VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
	pNext = DE_NULL;
	flags			= 0u;
	viewportCount	= _viewportCount;
	scissorCount	= _viewportCount;

	if (!_viewports.size())
	{
		m_viewports.resize(viewportCount);
		deMemset(&m_viewports[0], 0, sizeof(m_viewports[0]) * m_viewports.size());
	}
	else
	{
		m_viewports = _viewports;
	}

	if (!_scissors.size())
	{
		m_scissors.resize(scissorCount);
		deMemset(&m_scissors[0], 0, sizeof(m_scissors[0]) * m_scissors.size());
	}
	else
	{
		m_scissors = _scissors;
	}

	pViewports	= &m_viewports[0];
	pScissors	= &m_scissors[0];
}